

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceptor.cpp
# Opt level: O0

void __thiscall
booster::aio::acceptor::async_accept(acceptor *this,stream_socket *target,event_handler *h)

{
  bool bVar1;
  stream_socket *_t;
  basic_io_device *in_RDI;
  pointer acceptor;
  pointer in_stack_ffffffffffffff98;
  basic_io_device *this_00;
  acceptor *in_stack_ffffffffffffffa8;
  unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
  *ptr;
  event_handler *in_stack_ffffffffffffffb0;
  __uniq_ptr_impl<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
  in_stack_ffffffffffffffc0;
  basic_io_device local_20;
  
  bVar1 = basic_io_device::dont_block(in_RDI,in_stack_ffffffffffffffb0);
  if (bVar1) {
    _t = (stream_socket *)operator_new(0x28);
    anon_unknown_3::async_acceptor::async_acceptor
              ((async_acceptor *)
               in_stack_ffffffffffffffc0._M_t.
               super__Tuple_impl<0UL,_booster::aio::(anonymous_namespace)::async_acceptor_*,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
               .super__Head_base<0UL,_booster::aio::(anonymous_namespace)::async_acceptor_*,_false>.
               _M_head_impl,(event_handler *)in_RDI,_t,in_stack_ffffffffffffffa8);
    this_00 = &local_20;
    std::
    unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>>
    ::unique_ptr<std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>,void>
              ((unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
                *)this_00,in_stack_ffffffffffffff98);
    ptr = (unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
           *)&stack0xffffffffffffffc0;
    std::
    unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
    ::unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
                  *)this_00,
                 (unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
                  *)in_stack_ffffffffffffff98);
    callback<void_(const_std::error_code_&)>::
    callback<booster::aio::(anonymous_namespace)::async_acceptor>
              ((callback<void_(const_std::error_code_&)> *)_t,ptr);
    basic_io_device::on_readable(this_00,(event_handler *)in_stack_ffffffffffffff98);
    callback<void_(const_std::error_code_&)>::~callback
              ((callback<void_(const_std::error_code_&)> *)0x218dcf);
    std::
    unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
    ::~unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
                   *)this_00);
    std::
    unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
    ::~unique_ptr((unique_ptr<booster::aio::(anonymous_namespace)::async_acceptor,_std::default_delete<booster::aio::(anonymous_namespace)::async_acceptor>_>
                   *)this_00);
  }
  return;
}

Assistant:

void acceptor::async_accept(stream_socket &target,event_handler const &h)
{
	if(!dont_block(h))
		return;
	async_acceptor::pointer acceptor(new async_acceptor( h, &target, this ));
	on_readable(std::move(acceptor));
}